

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

double raplcap_pd_get_energy_counter_max(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  byte bVar1;
  raplcap_msr *ctx;
  int *piVar2;
  double dVar3;
  
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    bVar1 = (byte)((ulong)ZONE_OFFSETS_ENERGY[zone] >> 0x3f);
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    bVar1 = 1;
  }
  if ((ctx != (raplcap_msr *)0x0) && (bVar1 == 0)) {
    dVar3 = msr_get_energy_counter_max(&ctx->ctx,zone);
    return dVar3;
  }
  return -1.0;
}

Assistant:

double raplcap_pd_get_energy_counter_max(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_ENERGY);
  raplcap_log(DEBUG, "raplcap_pd_get_energy_counter_max: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0) {
    return -1;
  }
  return msr_get_energy_counter_max(&state->ctx, zone);
}